

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall
gvr::anon_unknown_3::PLYProperty::PLYProperty
          (PLYProperty *this,string *propname,ply_type t_size,ply_type t_value,ply_encoding encoding
          )

{
  void *pvVar1;
  ply_encoding in_ECX;
  ply_encoding in_EDX;
  PLYValueList *in_RSI;
  ply_encoding *in_RDI;
  ply_encoding in_R8D;
  
  *in_RDI = in_R8D;
  std::__cxx11::string::string((string *)(in_RDI + 2),(string *)in_RSI);
  in_RDI[10] = in_EDX;
  in_RDI[0xb] = in_ECX;
  pvVar1 = operator_new(0x40);
  PLYValueList::PLYValueList(in_RSI,in_EDX,in_ECX,in_R8D);
  *(void **)(in_RDI + 0xc) = pvVar1;
  in_RDI[0xe] = ply_ascii;
  in_RDI[0xf] = ply_ascii;
  return;
}

Assistant:

PLYProperty::PLYProperty(const std::string &propname, ply_type t_size, ply_type t_value,
                         ply_encoding encoding): enc(encoding), name(propname)
{
  tsize=t_size;
  tvalue=t_value;
  value=new PLYValueList(tsize, tvalue, encoding);
  receiver=0;
}